

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O3

void __thiscall Imf_3_4::Context::addHeader(Context *this,int partnum,Header *h)

{
  _Base_ptr __s1;
  long *plVar1;
  int iVar2;
  const_iterator cVar3;
  ConstIterator CVar4;
  char *__s1_00;
  long lVar5;
  ChannelList *this_00;
  const_iterator cVar6;
  ConstIterator CVar7;
  ArgExc *this_01;
  
  cVar3._M_node = (_Base_ptr)Header::begin(h);
  do {
    CVar4 = Header::end(h);
    if ((const_iterator)cVar3._M_node == CVar4._i._M_node) {
      return;
    }
    plVar1 = *(long **)(cVar3._M_node + 9);
    __s1_00 = (char *)(**(code **)(*plVar1 + 0x10))(plVar1);
    __s1 = cVar3._M_node + 1;
    iVar2 = strcmp((char *)__s1,"channels");
    if (iVar2 == 0) {
      this_00 = Header::channels(h);
      cVar6._M_node = (_Base_ptr)ChannelList::begin(this_00);
      while( true ) {
        CVar7 = ChannelList::end(this_00);
        if ((const_iterator)cVar6._M_node == CVar7._i._M_node) break;
        iVar2 = exr_add_channel(*(this->_ctxt).
                                 super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,partnum,cVar6._M_node + 1,cVar6._M_node[9]._M_color,
                                *(undefined1 *)((long)&cVar6._M_node[9]._M_parent + 4),
                                *(undefined4 *)&cVar6._M_node[9].field_0x4,
                                *(undefined4 *)&cVar6._M_node[9]._M_parent);
        if (iVar2 != 0) {
          this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy channel information");
          goto LAB_001626ee;
        }
        cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
      }
    }
    else {
      iVar2 = strcmp((char *)__s1,"lineOrder");
      if (iVar2 == 0) {
        lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                               &TypedAttribute<Imf_3_4::LineOrder>::typeinfo,0);
        if (lVar5 == 0) {
          this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
LAB_001626ee:
          __cxa_throw(this_01,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        iVar2 = exr_set_lineorder(*(this->_ctxt).
                                   super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,partnum,*(undefined4 *)(lVar5 + 8));
        if (iVar2 != 0) {
          this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
          goto LAB_001626ee;
        }
      }
      else {
        iVar2 = strcmp(__s1_00,"tiledesc");
        if (iVar2 == 0) {
          lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                 &TypedAttribute<Imf_3_4::TileDescription>::typeinfo,0);
          if (lVar5 == 0) {
            this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
            goto LAB_001626ee;
          }
          iVar2 = exr_set_tile_descriptor
                            (*(this->_ctxt).
                              super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,partnum,*(undefined4 *)(lVar5 + 8),*(undefined4 *)(lVar5 + 0xc)
                             ,*(undefined4 *)(lVar5 + 0x10),*(undefined4 *)(lVar5 + 0x14));
          if (iVar2 != 0) {
            this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
            goto LAB_001626ee;
          }
        }
        else {
          iVar2 = strcmp(__s1_00,"string");
          if (iVar2 == 0) {
            lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                   &TypedAttribute<std::__cxx11::string>::typeinfo,0);
            if (lVar5 == 0) {
              this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
              goto LAB_001626ee;
            }
            iVar2 = exr_attr_set_string(*(this->_ctxt).
                                         super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,partnum,__s1);
            if (iVar2 != 0) {
              this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
              goto LAB_001626ee;
            }
          }
          else {
            iVar2 = strcmp(__s1_00,"int");
            if (iVar2 == 0) {
              lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,&TypedAttribute<int>::typeinfo,0);
              if (lVar5 == 0) {
                this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
                goto LAB_001626ee;
              }
              iVar2 = exr_attr_set_int(*(this->_ctxt).
                                        super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr,partnum,__s1);
              if (iVar2 != 0) {
                this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
                goto LAB_001626ee;
              }
            }
            else {
              iVar2 = strcmp(__s1_00,"float");
              if (iVar2 == 0) {
                lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,&TypedAttribute<float>::typeinfo,
                                       0);
                if (lVar5 == 0) {
                  this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                  Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
                  goto LAB_001626ee;
                }
                iVar2 = exr_attr_set_float(*(undefined4 *)(lVar5 + 8),
                                           *(this->_ctxt).
                                            super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr,partnum,__s1);
                if (iVar2 != 0) {
                  this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                  Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
                  goto LAB_001626ee;
                }
              }
              else {
                iVar2 = strcmp(__s1_00,"double");
                if (iVar2 == 0) {
                  lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                         &TypedAttribute<double>::typeinfo,0);
                  if (lVar5 == 0) {
                    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
                    goto LAB_001626ee;
                  }
                  iVar2 = exr_attr_set_double((int)*(undefined8 *)(lVar5 + 8),
                                              *(this->_ctxt).
                                               super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr,partnum,__s1);
                  if (iVar2 != 0) {
                    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
                    goto LAB_001626ee;
                  }
                }
                else {
                  iVar2 = strcmp(__s1_00,"compression");
                  if (iVar2 == 0) {
                    lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                           &TypedAttribute<Imf_3_4::Compression>::typeinfo,0);
                    if (lVar5 == 0) {
                      this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                      Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
                      goto LAB_001626ee;
                    }
                    iVar2 = exr_attr_set_compression
                                      (*(this->_ctxt).
                                        super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr,partnum,__s1);
                    if (iVar2 != 0) {
                      this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                      Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
                      goto LAB_001626ee;
                    }
                  }
                  else {
                    iVar2 = strcmp(__s1_00,"envmap");
                    if (iVar2 == 0) {
                      lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                             &TypedAttribute<Imf_3_4::Envmap>::typeinfo,0);
                      if (lVar5 == 0) {
                        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                        Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
                        goto LAB_001626ee;
                      }
                      iVar2 = exr_attr_set_envmap(*(this->_ctxt).
                                                                                                      
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                      if (iVar2 != 0) {
                        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                        Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
                        goto LAB_001626ee;
                      }
                    }
                    else {
                      iVar2 = strcmp(__s1_00,"v2i");
                      if (iVar2 == 0) {
                        lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                               &TypedAttribute<Imath_3_2::Vec2<int>>::typeinfo,0);
                        if (lVar5 == 0) {
                          this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                          Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
                          goto LAB_001626ee;
                        }
                        iVar2 = exr_attr_set_v2i(*(this->_ctxt).
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                        if (iVar2 != 0) {
                          this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                          Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
                          goto LAB_001626ee;
                        }
                      }
                      else {
                        iVar2 = strcmp(__s1_00,"v2f");
                        if (iVar2 == 0) {
                          lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                                 &TypedAttribute<Imath_3_2::Vec2<float>>::typeinfo,0
                                                );
                          if (lVar5 == 0) {
                            this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                            Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
                            goto LAB_001626ee;
                          }
                          iVar2 = exr_attr_set_v2f(*(this->_ctxt).
                                                                                                        
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                          if (iVar2 != 0) {
                            this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                            Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
                            goto LAB_001626ee;
                          }
                        }
                        else {
                          iVar2 = strcmp(__s1_00,"v2d");
                          if (iVar2 == 0) {
                            lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                                   &TypedAttribute<Imath_3_2::Vec2<double>>::
                                                    typeinfo,0);
                            if (lVar5 == 0) {
                              this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                              Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
                              goto LAB_001626ee;
                            }
                            iVar2 = exr_attr_set_v2d(*(this->_ctxt).
                                                                                                            
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                            if (iVar2 != 0) {
                              this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                              Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
                              goto LAB_001626ee;
                            }
                          }
                          else {
                            iVar2 = strcmp(__s1_00,"v3i");
                            if (iVar2 == 0) {
                              lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                                     &TypedAttribute<Imath_3_2::Vec3<int>>::typeinfo
                                                     ,0);
                              if (lVar5 == 0) {
                                this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
                                goto LAB_001626ee;
                              }
                              iVar2 = exr_attr_set_v3i(*(this->_ctxt).
                                                                                                                
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                              if (iVar2 != 0) {
                                this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
                                goto LAB_001626ee;
                              }
                            }
                            else {
                              iVar2 = strcmp(__s1_00,"v3f");
                              if (iVar2 == 0) {
                                lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                                       &TypedAttribute<Imath_3_2::Vec3<float>>::
                                                        typeinfo,0);
                                if (lVar5 == 0) {
                                  this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                  Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
                                  goto LAB_001626ee;
                                }
                                iVar2 = exr_attr_set_v3f(*(this->_ctxt).
                                                                                                                    
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                                if (iVar2 != 0) {
                                  this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                  Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
                                  goto LAB_001626ee;
                                }
                              }
                              else {
                                iVar2 = strcmp(__s1_00,"v3d");
                                if (iVar2 == 0) {
                                  lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                                         &TypedAttribute<Imath_3_2::Vec3<double>>::
                                                          typeinfo,0);
                                  if (lVar5 == 0) {
                                    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                    Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
                                    goto LAB_001626ee;
                                  }
                                  iVar2 = exr_attr_set_v3d(*(this->_ctxt).
                                                                                                                        
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                                  if (iVar2 != 0) {
                                    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                    Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
                                    goto LAB_001626ee;
                                  }
                                }
                                else {
                                  iVar2 = strcmp(__s1_00,"m33f");
                                  if (iVar2 == 0) {
                                    lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                                           &
                                                  TypedAttribute<Imath_3_2::Matrix33<float>>::
                                                  typeinfo,0);
                                    if (lVar5 == 0) {
                                      this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                      Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
                                      goto LAB_001626ee;
                                    }
                                    iVar2 = exr_attr_set_m33f(*(this->_ctxt).
                                                                                                                              
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                                    if (iVar2 != 0) {
                                      this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                      Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
                                      goto LAB_001626ee;
                                    }
                                  }
                                  else {
                                    iVar2 = strcmp(__s1_00,"m33d");
                                    if (iVar2 == 0) {
                                      lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                                             &
                                                  TypedAttribute<Imath_3_2::Matrix33<double>>::
                                                  typeinfo,0);
                                      if (lVar5 == 0) {
                                        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                        Iex_3_4::ArgExc::ArgExc(this_01,"unexpected type mismatch");
                                        goto LAB_001626ee;
                                      }
                                      iVar2 = exr_attr_set_m33d(*(this->_ctxt).
                                                                                                                                  
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                                      if (iVar2 != 0) {
                                        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                        Iex_3_4::ArgExc::ArgExc(this_01,"Unable to copy attribute");
                                        goto LAB_001626ee;
                                      }
                                    }
                                    else {
                                      iVar2 = strcmp(__s1_00,"m44f");
                                      if (iVar2 == 0) {
                                        lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                                               &
                                                  TypedAttribute<Imath_3_2::Matrix44<float>>::
                                                  typeinfo,0);
                                        if (lVar5 == 0) {
                                          this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                          Iex_3_4::ArgExc::ArgExc
                                                    (this_01,"unexpected type mismatch");
                                          goto LAB_001626ee;
                                        }
                                        iVar2 = exr_attr_set_m44f(*(this->_ctxt).
                                                                                                                                      
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                                        if (iVar2 != 0) {
                                          this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                          Iex_3_4::ArgExc::ArgExc
                                                    (this_01,"Unable to copy attribute");
                                          goto LAB_001626ee;
                                        }
                                      }
                                      else {
                                        iVar2 = strcmp(__s1_00,"m44d");
                                        if (iVar2 == 0) {
                                          lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                                                 &
                                                  TypedAttribute<Imath_3_2::Matrix44<double>>::
                                                  typeinfo,0);
                                          if (lVar5 == 0) {
                                            this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                            Iex_3_4::ArgExc::ArgExc
                                                      (this_01,"unexpected type mismatch");
                                            goto LAB_001626ee;
                                          }
                                          iVar2 = exr_attr_set_m44d(*(this->_ctxt).
                                                                                                                                          
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                                          if (iVar2 != 0) {
                                            this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                            Iex_3_4::ArgExc::ArgExc
                                                      (this_01,"Unable to copy attribute");
                                            goto LAB_001626ee;
                                          }
                                        }
                                        else {
                                          iVar2 = strcmp(__s1_00,"box2i");
                                          if (iVar2 == 0) {
                                            lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                                                   &
                                                  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>
                                                  ::typeinfo,0);
                                            if (lVar5 == 0) {
                                              this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                              Iex_3_4::ArgExc::ArgExc
                                                        (this_01,"unexpected type mismatch");
                                              goto LAB_001626ee;
                                            }
                                            iVar2 = exr_attr_set_box2i(*(this->_ctxt).
                                                                                                                                                
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                                            if (iVar2 != 0) {
                                              this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                              Iex_3_4::ArgExc::ArgExc
                                                        (this_01,"Unable to copy attribute");
                                              goto LAB_001626ee;
                                            }
                                          }
                                          else {
                                            iVar2 = strcmp(__s1_00,"box2f");
                                            if (iVar2 == 0) {
                                              lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                                                     &
                                                  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>
                                                  ::typeinfo,0);
                                              if (lVar5 == 0) {
                                                this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                                Iex_3_4::ArgExc::ArgExc
                                                          (this_01,"unexpected type mismatch");
                                                goto LAB_001626ee;
                                              }
                                              iVar2 = exr_attr_set_box2f(*(this->_ctxt).
                                                                                                                                                    
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                                              if (iVar2 != 0) {
                                                this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                                                Iex_3_4::ArgExc::ArgExc
                                                          (this_01,"Unable to copy attribute");
                                                goto LAB_001626ee;
                                              }
                                            }
                                            else {
                                              iVar2 = strcmp(__s1_00,"chromaticities");
                                              if (iVar2 == 0) {
                                                lVar5 = __dynamic_cast(plVar1,&Attribute::typeinfo,
                                                                       &
                                                  TypedAttribute<Imf_3_4::Chromaticities>::typeinfo,
                                                  0);
                                                if (lVar5 == 0) {
                                                  this_01 = (ArgExc *)__cxa_allocate_exception(0x48)
                                                  ;
                                                  Iex_3_4::ArgExc::ArgExc
                                                            (this_01,"unexpected type mismatch");
                                                  goto LAB_001626ee;
                                                }
                                                iVar2 = exr_attr_set_chromaticities
                                                                  (*(this->_ctxt).
                                                                                                                                        
                                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,partnum,__s1);
                                                if (iVar2 != 0) {
                                                  this_01 = (ArgExc *)__cxa_allocate_exception(0x48)
                                                  ;
                                                  Iex_3_4::ArgExc::ArgExc
                                                            (this_01,"Unable to copy attribute");
                                                  goto LAB_001626ee;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
  } while( true );
}

Assistant:

void Context::addHeader (int partnum, const Header &h)
{
    exr_result_t rv;
    // TODO: ImfHeader iterator types should support operator* so they can
    // use ranged-based for
    for (auto i = h.begin (); i != h.end (); ++i)
    {
        const Attribute& a = i.attribute ();
        const char* attrT = a.typeName ();

        if (!strcmp (i.name (), "channels"))
        {
            const ChannelList& chans = h.channels ();

            for (auto c = chans.begin (); c != chans.end (); ++c)
            {
                const Channel &cdef = c.channel ();
                rv = exr_add_channel (
                    *_ctxt, partnum, c.name (),
                    (exr_pixel_type_t)cdef.type,
                    cdef.pLinear ? EXR_PERCEPTUALLY_LINEAR : EXR_PERCEPTUALLY_LOGARITHMIC,
                    cdef.xSampling,
                    cdef.ySampling);
                if (rv != EXR_ERR_SUCCESS)
                    throw IEX_NAMESPACE::ArgExc ("Unable to copy channel information");
            }
            continue;
        }

        if (!strcmp (i.name (), "lineOrder"))
        {
            const LineOrderAttribute *attr =
                dynamic_cast<const LineOrderAttribute*> (&a);
            if (!attr)
                throw IEX_NAMESPACE::ArgExc ("unexpected type mismatch");
            rv = exr_set_lineorder (
                *_ctxt, partnum, (exr_lineorder_t)attr->value ());
            if (rv != EXR_ERR_SUCCESS)
                throw IEX_NAMESPACE::ArgExc ("Unable to copy attribute");
            continue;
        }

        if (!strcmp (attrT, "tiledesc"))
        {
            const TileDescriptionAttribute *attr =
                dynamic_cast<const TileDescriptionAttribute*> (&a);
            if (!attr)
                throw IEX_NAMESPACE::ArgExc ("unexpected type mismatch");
            TileDescription td = attr->value ();

            rv = exr_set_tile_descriptor (
                *_ctxt, partnum,
                td.xSize,
                td.ySize,
                (exr_tile_level_mode_t)td.mode,
                (exr_tile_round_mode_t)td.roundingMode);

            if (rv != EXR_ERR_SUCCESS)
                throw IEX_NAMESPACE::ArgExc ("Unable to copy attribute");
            continue;
        }

        EXR_SET_ATTR(string, StringAttribute, attr->value ().c_str ());
        EXR_SET_ATTR(int, IntAttribute, attr->value ());
        EXR_SET_ATTR(float, FloatAttribute, attr->value ());
        EXR_SET_ATTR(double, DoubleAttribute, attr->value ());
        EXR_SET_ATTR(compression, CompressionAttribute, (exr_compression_t)attr->value ());
        EXR_SET_ATTR(envmap, EnvmapAttribute, (exr_envmap_t)attr->value ());
        EXR_SET_ATTR(v2i, V2iAttribute,
                     reinterpret_cast<const exr_attr_v2i_t*>(&(attr->value ())));
        EXR_SET_ATTR(v2f, V2fAttribute,
                     reinterpret_cast<const exr_attr_v2f_t*>(&(attr->value ())));
        EXR_SET_ATTR(v2d, V2dAttribute,
                     reinterpret_cast<const exr_attr_v2d_t*>(&(attr->value ())));
        EXR_SET_ATTR(v3i, V3iAttribute,
                     reinterpret_cast<const exr_attr_v3i_t*>(&(attr->value ())));
        EXR_SET_ATTR(v3f, V3fAttribute,
                     reinterpret_cast<const exr_attr_v3f_t*>(&(attr->value ())));
        EXR_SET_ATTR(v3d, V3dAttribute,
                     reinterpret_cast<const exr_attr_v3d_t*>(&(attr->value ())));
        EXR_SET_ATTR(m33f, M33fAttribute,
                     reinterpret_cast<const exr_attr_m33f_t*>(&(attr->value ())));
        EXR_SET_ATTR(m33d, M33dAttribute,
                     reinterpret_cast<const exr_attr_m33d_t*>(&(attr->value ())));
        EXR_SET_ATTR(m44f, M44fAttribute,
                     reinterpret_cast<const exr_attr_m44f_t*>(&(attr->value ())));
        EXR_SET_ATTR(m44d, M44dAttribute,
                     reinterpret_cast<const exr_attr_m44d_t*>(&(attr->value ())));
        EXR_SET_ATTR(box2i, Box2iAttribute,
                     reinterpret_cast<const exr_attr_box2i_t*>(&(attr->value ())));
        EXR_SET_ATTR(box2f, Box2fAttribute,
                     reinterpret_cast<const exr_attr_box2f_t*>(&(attr->value ())));

        if (!strcmp (attrT, "chromaticities"))
        {
            const ChromaticitiesAttribute *attr =
                dynamic_cast<const ChromaticitiesAttribute*> (&a);
            if (!attr)
                throw IEX_NAMESPACE::ArgExc ("unexpected type mismatch");
            Chromaticities ac = attr->value ();
            exr_attr_chromaticities_t cac;

            cac.red_x = ac.red.x;
            cac.red_y = ac.red.y;
            cac.green_x = ac.green.x;
            cac.green_y = ac.green.y;
            cac.blue_x = ac.blue.x;
            cac.blue_y = ac.blue.y;
            cac.white_x = ac.white.x;
            cac.white_y = ac.white.y;

            rv = exr_attr_set_chromaticities (
                *_ctxt, partnum, i.name (), &cac);

            if (rv != EXR_ERR_SUCCESS)
                throw IEX_NAMESPACE::ArgExc ("Unable to copy attribute");
            continue;
        }

        if (!strcmp (attrT, "stringvector"))
        {
            continue;
        }

        if (!strcmp (attrT, "floatvector"))
        {
            continue;
        }

        if (!strcmp (attrT, "preview"))
        {
            continue;
        }

        if (!strcmp (attrT, "rational"))
        {
            continue;
        }

        if (!strcmp (attrT, "timecode"))
        {
            continue;
        }

        if (!strcmp (attrT, "keycode"))
        {
            continue;
        }

        if (!strcmp (attrT, "deepImageState"))
        {
            continue;
        }

        //THROW (
        //    IEX_NAMESPACE::LogicExc,
        //    "Conversion of attribute '" << i.name () << "' of type '" << attrT
        //    << "' to core value not yet implemented");
    }
}